

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<kj::File> __thiscall kj::newInMemoryFile(kj *this,Clock *clock)

{
  undefined8 *puVar1;
  AtomicRefcounted *refcounted;
  undefined1 auVar2 [16];
  Own<kj::File> OVar3;
  
  puVar1 = (undefined8 *)operator_new(0x68);
  *(undefined4 *)(puVar1 + 2) = 0;
  *puVar1 = &PTR_getFd_0030df20;
  puVar1[1] = &PTR_disposeImpl_0030dfb0;
  _::Mutex::Mutex((Mutex *)(puVar1 + 3));
  puVar1[6] = clock;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  auVar2 = (*(code *)**(undefined8 **)clock)(clock);
  OVar3.ptr = auVar2._8_8_;
  puVar1[0xb] = auVar2._0_8_;
  *(undefined4 *)(puVar1 + 0xc) = 0;
  LOCK();
  *(int *)(puVar1 + 2) = *(int *)(puVar1 + 2) + 1;
  UNLOCK();
  *(undefined8 **)this = puVar1 + 1;
  *(undefined8 **)(this + 8) = puVar1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<File> newInMemoryFile(const Clock& clock) {
  return atomicRefcounted<InMemoryFile>(clock);
}